

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O0

void __thiscall
BS::thread_pool<(unsigned_char)'\x00'>::worker
          (thread_pool<(unsigned_char)__x00_> *this,stop_token *stop_token,size_t idx)

{
  long lVar1;
  bool bVar2;
  long in_RDI;
  long *in_FS_OFFSET;
  stop_token *unaff_retaddr;
  unique_lock<std::mutex> *in_stack_00000008;
  condition_variable_any *in_stack_00000010;
  anon_class_8_1_8991fb9c in_stack_00000018;
  task_t task;
  unique_lock<std::mutex> tasks_lock;
  mutex_type *in_stack_ffffffffffffff48;
  function<void_(unsigned_long)> *in_stack_ffffffffffffff50;
  thread_pool<(unsigned_char)__x00_> **in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  thread_pool<(unsigned_char)__x00_> *in_stack_ffffffffffffff78;
  int local_64;
  undefined8 local_30;
  undefined8 local_28;
  
  std::optional<void*>::operator=
            ((optional<void_*> *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  std::optional<unsigned_long>::optional<const_unsigned_long_&,_true>
            ((optional<unsigned_long> *)in_stack_ffffffffffffff50,
             (unsigned_long *)in_stack_ffffffffffffff48);
  lVar1 = *in_FS_OFFSET;
  *(undefined8 *)(lVar1 + -0x48) = local_30;
  *(undefined8 *)(lVar1 + -0x40) = local_28;
  std::function<void_(unsigned_long)>::operator()
            (in_stack_ffffffffffffff50,(unsigned_long)in_stack_ffffffffffffff48);
  do {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    *(long *)(in_RDI + 0x130) = *(long *)(in_RDI + 0x130) + -1;
    if ((((*(byte *)(in_RDI + 0x148) & 1) != 0) && (*(long *)(in_RDI + 0x130) == 0)) &&
       (bVar2 = std::
                queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                ::empty((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                         *)0x329cf9), bVar2)) {
      std::condition_variable::notify_all();
    }
    in_stack_ffffffffffffff50 = (function<void_(unsigned_long)> *)(in_RDI + 0x48);
    std::stop_token::stop_token
              ((stop_token *)in_stack_ffffffffffffff50,(stop_token *)in_stack_ffffffffffffff48);
    std::_V2::condition_variable_any::
    wait<std::unique_lock<std::mutex>,BS::thread_pool<(unsigned_char)0>::worker(std::stop_token_const&,unsigned_long)::_lambda()_1_>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_00000018);
    std::stop_token::~stop_token((stop_token *)0x329d83);
    bVar2 = std::stop_token::stop_requested((stop_token *)in_stack_ffffffffffffff50);
    if (bVar2) {
      local_64 = 3;
    }
    else {
      pop_task(in_stack_ffffffffffffff78);
      *(long *)(in_RDI + 0x130) = *(long *)(in_RDI + 0x130) + 1;
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_ffffffffffffff50);
      std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffff50);
      std::function<void_()>::~function((function<void_()> *)0x329e46);
      local_64 = 0;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff50)
    ;
  } while (local_64 == 0);
  std::function<void_(unsigned_long)>::operator()
            (in_stack_ffffffffffffff50,(unsigned_long)in_stack_ffffffffffffff48);
  std::optional<unsigned_long>::operator=((optional<unsigned_long> *)(*in_FS_OFFSET + -0x48));
  std::optional<void_*>::operator=((optional<void_*> *)(*in_FS_OFFSET + -0x58));
  return;
}

Assistant:

void worker(BS_THREAD_POOL_WORKER_TOKEN const std::size_t idx)
    {
        this_thread::my_pool = this;
        this_thread::my_index = idx;
        init_func(idx);
        while (true)
        {
            std::unique_lock tasks_lock(tasks_mutex);
            --tasks_running;
            if constexpr (pause_enabled)
            {
                if (waiting && (tasks_running == 0) && (paused || tasks.empty()))
                    tasks_done_cv.notify_all();
            }
            else
            {
                if (waiting && (tasks_running == 0) && tasks.empty())
                    tasks_done_cv.notify_all();
            }
            task_available_cv.wait(tasks_lock BS_THREAD_POOL_WAIT_TOKEN,
                [this]
                {
                    if constexpr (pause_enabled)
                        return !(paused || tasks.empty()) BS_THREAD_POOL_OR_STOP_CONDITION;
                    else
                        return !tasks.empty() BS_THREAD_POOL_OR_STOP_CONDITION;
                });
            if (BS_THREAD_POOL_STOP_CONDITION)
                break;
            {
                task_t task = pop_task(); // NOLINT(misc-const-correctness) In C++23 this cannot be const since `std::move_only_function::operator()` is not a const member function.
                ++tasks_running;
                tasks_lock.unlock();
#ifdef __cpp_exceptions
                try
                {
#endif
                    task();
#ifdef __cpp_exceptions
                }
                catch (...)
                {
                }
#endif
            }
        }
        cleanup_func(idx);
        this_thread::my_index = std::nullopt;
        this_thread::my_pool = std::nullopt;
    }